

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_ringbuffer.h
# Opt level: O3

int __thiscall
ring_buffer_base<cubeb_log_message>::enqueue
          (ring_buffer_base<cubeb_log_message> *this,cubeb_log_message *elements,int count)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  cubeb_log_message *pcVar6;
  long lVar7;
  
  uVar1 = (this->write_index_).super___atomic_base<int>._M_i;
  iVar2 = (this->read_index_).super___atomic_base<int>._M_i;
  iVar5 = this->capacity_;
  iVar4 = 0;
  if ((int)(uVar1 + 1) % iVar5 != iVar2) {
    iVar4 = 0;
    if (iVar2 <= (int)uVar1) {
      iVar4 = iVar5;
    }
    iVar4 = iVar4 + ~uVar1 + iVar2;
    if (count <= iVar4) {
      iVar4 = count;
    }
    iVar5 = iVar5 - uVar1;
    iVar2 = iVar5;
    if (iVar4 < iVar5) {
      iVar2 = iVar4;
    }
    if (elements == (cubeb_log_message *)0x0) {
      if (iVar2 != 0) {
        memset((this->data_)._M_t.
               super___uniq_ptr_impl<cubeb_log_message,_std::default_delete<cubeb_log_message[]>_>.
               _M_t.
               super__Tuple_impl<0UL,_cubeb_log_message_*,_std::default_delete<cubeb_log_message[]>_>
               .super__Head_base<0UL,_cubeb_log_message_*,_false>._M_head_impl + (int)uVar1,0,
               (long)iVar2 << 8);
      }
      if (iVar5 < iVar4) {
        memset((this->data_)._M_t.
               super___uniq_ptr_impl<cubeb_log_message,_std::default_delete<cubeb_log_message[]>_>.
               _M_t.
               super__Tuple_impl<0UL,_cubeb_log_message_*,_std::default_delete<cubeb_log_message[]>_>
               .super__Head_base<0UL,_cubeb_log_message_*,_false>._M_head_impl,0,
               (long)(iVar4 - iVar2) << 8);
      }
    }
    else {
      pcVar6 = (this->data_)._M_t.
               super___uniq_ptr_impl<cubeb_log_message,_std::default_delete<cubeb_log_message[]>_>.
               _M_t.
               super__Tuple_impl<0UL,_cubeb_log_message_*,_std::default_delete<cubeb_log_message[]>_>
               .super__Head_base<0UL,_cubeb_log_message_*,_false>._M_head_impl;
      if (iVar2 != 0) {
        lVar7 = 0;
        lVar3 = (long)iVar2;
        do {
          memcpy(pcVar6[(int)uVar1].storage + lVar7,elements->storage + lVar7,0x100);
          lVar7 = lVar7 + 0x100;
          lVar3 = lVar3 + -1;
        } while (lVar3 != 0);
        pcVar6 = (this->data_)._M_t.
                 super___uniq_ptr_impl<cubeb_log_message,_std::default_delete<cubeb_log_message[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cubeb_log_message_*,_std::default_delete<cubeb_log_message[]>_>
                 .super__Head_base<0UL,_cubeb_log_message_*,_false>._M_head_impl;
      }
      if (iVar5 < iVar4) {
        lVar3 = (long)(iVar4 - iVar2);
        lVar7 = 0;
        do {
          memcpy(pcVar6->storage + lVar7,elements[iVar2].storage + lVar7,0x100);
          lVar7 = lVar7 + 0x100;
          lVar3 = lVar3 + -1;
        } while (lVar3 != 0);
      }
    }
    (this->write_index_).super___atomic_base<int>._M_i = (int)(uVar1 + iVar4) % this->capacity_;
  }
  return iVar4;
}

Assistant:

int enqueue(T * elements, int count)
  {
#ifndef NDEBUG
    assert_correct_thread(producer_id);
#endif

    int wr_idx = write_index_.load(std::memory_order_relaxed);
    int rd_idx = read_index_.load(std::memory_order_acquire);

    if (full_internal(rd_idx, wr_idx)) {
      return 0;
    }

    int to_write = std::min(available_write_internal(rd_idx, wr_idx), count);

    /* First part, from the write index to the end of the array. */
    int first_part = std::min(storage_capacity() - wr_idx, to_write);
    /* Second part, from the beginning of the array */
    int second_part = to_write - first_part;

    if (elements) {
      Copy(data_.get() + wr_idx, elements, first_part);
      Copy(data_.get(), elements + first_part, second_part);
    } else {
      ConstructDefault(data_.get() + wr_idx, first_part);
      ConstructDefault(data_.get(), second_part);
    }

    write_index_.store(increment_index(wr_idx, to_write),
                       std::memory_order_release);

    return to_write;
  }